

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::CompMatFuncBase<2,_2>::doApply
          (IRet *__return_storage_ptr__,CompMatFuncBase<2,_2> *this,EvalContext *ctx,IArgs *iargs)

{
  Interval *pIVar1;
  IRet *pIVar2;
  bool bVar3;
  long *plVar4;
  long lVar5;
  IArgs *pIVar6;
  undefined8 uVar7;
  bool bVar8;
  long lVar9;
  undefined1 local_7e;
  undefined1 local_7d;
  uint local_7c;
  IRet *local_78;
  EvalContext *local_70;
  Interval *local_68;
  Interval *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  double dStack_40;
  double local_38;
  
  pIVar6 = iargs;
  local_78 = __return_storage_ptr__;
  local_70 = ctx;
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix(__return_storage_ptr__);
  uVar7 = CONCAT71((int7)((ulong)pIVar6 >> 8),1);
  lVar5 = 0;
  do {
    pIVar2 = local_78;
    local_7c = (uint)uVar7;
    lVar9 = 0;
    bVar3 = true;
    do {
      bVar8 = bVar3;
      plVar4 = (long *)(**(code **)(*(long *)this + 0x58))(this);
      local_68 = (iargs->a->m_data).m_data[lVar5].m_data + lVar9;
      local_60 = (iargs->b->m_data).m_data[lVar5].m_data + lVar9;
      local_58 = &local_7d;
      local_50 = &local_7e;
      (**(code **)(*plVar4 + 0x40))(&local_48,plVar4,local_70,&local_68);
      (pIVar2->m_data).m_data[lVar5].m_data[lVar9].m_hi = local_38;
      pIVar1 = (pIVar2->m_data).m_data[lVar5].m_data + lVar9;
      *(undefined8 *)pIVar1 = local_48;
      pIVar1->m_lo = dStack_40;
      lVar9 = 1;
      bVar3 = false;
    } while (bVar8);
    lVar5 = 1;
    uVar7 = 0;
  } while ((local_7c & 1) != 0);
  return local_78;
}

Assistant:

IRet	doApply	(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet			ret;

		for (int col = 0; col < Cols; ++col)
		{
			for (int row = 0; row < Rows; ++row)
				ret[col][row] = this->doGetScalarFunc().apply(ctx,
															  iargs.a[col][row],
															  iargs.b[col][row]);
		}

		return ret;
	}